

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O1

void __thiscall
cmGlobVerificationManager::AddCacheEntry
          (cmGlobVerificationManager *this,cmGlobCacheEntry *entry,string *variable,
          cmListFileBacktrace *backtrace,cmMessenger *messenger)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  pointer ppVar5;
  bool bVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  CacheEntryKey key;
  ostringstream message;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  undefined8 local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined8 local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  cmGlobVerificationManager *local_218;
  key_type local_210;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar6 = entry->Recurse;
  bVar2 = entry->ListDirectories;
  bVar3 = entry->FollowSymlinks;
  pcVar4 = (entry->Relative)._M_dataplus._M_p;
  local_258 = &local_248;
  local_218 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar4,pcVar4 + (entry->Relative)._M_string_length);
  local_238 = &local_228;
  pcVar4 = (entry->Expression)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar4,pcVar4 + (entry->Expression)._M_string_length);
  paVar1 = &local_210.Relative.field_2;
  if (local_258 == &local_248) {
    local_210.Relative.field_2._8_8_ = local_248._8_8_;
    local_210.Relative._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_210.Relative._M_dataplus._M_p = (pointer)local_258;
  }
  local_210.Relative.field_2._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
  local_210.Relative.field_2._M_local_buf[0] = local_248._M_local_buf[0];
  local_210.Expression._M_dataplus._M_p = (pointer)&local_210.Expression.field_2;
  if (local_238 == &local_228) {
    local_210.Expression.field_2._8_8_ = local_228._8_8_;
  }
  else {
    local_210.Expression._M_dataplus._M_p = (pointer)local_238;
  }
  local_210.Expression.field_2._M_allocated_capacity._1_7_ = local_228._M_allocated_capacity._1_7_;
  local_210.Expression.field_2._M_local_buf[0] = local_228._M_local_buf[0];
  local_228._M_local_buf[0] = '\0';
  local_230 = 0;
  local_248._M_local_buf[0] = '\0';
  local_250 = 0;
  local_258 = &local_248;
  local_238 = &local_228;
  local_210.Recurse = bVar6;
  local_210.ListDirectories = bVar2;
  local_210.FollowSymlinks = bVar3;
  pmVar7 = std::
           map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           ::operator[](&local_218->Cache,&local_210);
  if (pmVar7->Initialized == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar7->Files,&entry->Files);
    pmVar7->Initialized = true;
  }
  else {
    __first1 = (pmVar7->Files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (pmVar7->Files).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (entry->Files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((long)__last1 - (long)__first1 !=
         (long)(entry->Files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) ||
       (bVar6 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                          (__first1,__last1,__first2), !bVar6)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
           *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The glob expression\n ",0x15);
      CacheEntryKey::PrintGlobCommand(&local_210,(ostream *)local_1a8,variable);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\nwas already present in the glob cache but the directory contents have changed during the configuration run.\n"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Matching glob expressions:",0x1a);
      ppVar8 = (pmVar7->Backtraces).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (pmVar7->Backtraces).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar8 != ppVar5) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(ppVar8->first)._M_dataplus._M_p,
                     (ppVar8->first)._M_string_length);
          cmMessenger::PrintBacktraceTitle(messenger,(ostream *)local_1a8,&ppVar8->second);
          ppVar8 = ppVar8 + 1;
        } while (ppVar8 != ppVar5);
      }
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(messenger,FATAL_ERROR,&local_1c8,backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      goto LAB_005c1c37;
    }
  }
  std::
  vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
  ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace_const&>
            ((vector<std::pair<std::__cxx11::string,cmListFileBacktrace>,std::allocator<std::pair<std::__cxx11::string,cmListFileBacktrace>>>
              *)&pmVar7->Backtraces,variable,backtrace);
LAB_005c1c37:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.Expression._M_dataplus._M_p != &local_210.Expression.field_2) {
    operator_delete(local_210.Expression._M_dataplus._M_p,
                    local_210.Expression.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.Relative._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.Relative._M_dataplus._M_p,
                    local_210.Relative.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobVerificationManager::AddCacheEntry(
  const cmGlobCacheEntry& entry, const std::string& variable,
  const cmListFileBacktrace& backtrace, cmMessenger* messenger)
{
  CacheEntryKey key =
    CacheEntryKey(entry.Recurse, entry.ListDirectories, entry.FollowSymlinks,
                  entry.Relative, entry.Expression);
  CacheEntryValue& value = this->Cache[key];
  if (!value.Initialized) {
    value.Files = entry.Files;
    value.Initialized = true;
    value.Backtraces.emplace_back(variable, backtrace);
  } else if (value.Initialized && value.Files != entry.Files) {
    std::ostringstream message;
    message << std::boolalpha;
    message << "The glob expression\n ";
    key.PrintGlobCommand(message, variable);
    message << "\nwas already present in the glob cache but the directory "
               "contents have changed during the configuration run.\n";
    message << "Matching glob expressions:";
    for (auto const& bt : value.Backtraces) {
      message << "\n  " << std::get<0>(bt);
      messenger->PrintBacktraceTitle(message, std::get<1>(bt));
    }
    messenger->IssueMessage(MessageType::FATAL_ERROR, message.str(),
                            backtrace);
  } else {
    value.Backtraces.emplace_back(variable, backtrace);
  }
}